

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::
error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
::
error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>
          (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
           *this,descriptor<pstore::details::posix_descriptor_traits> *param_2,
          maybe<unsigned_char,_void> *param_3)

{
  tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
  *ptVar1;
  uchar *puVar2;
  
  this[0x10] = (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
                )0x0;
  ptVar1 = value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
                     ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>_>
                       *)this);
  (ptVar1->
  super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
  ).super__Tuple_impl<1UL,_pstore::maybe<unsigned_char,_void>_>.
  super__Head_base<1UL,_pstore::maybe<unsigned_char,_void>,_false>._M_head_impl.valid_ = false;
  if (param_3->valid_ == true) {
    puVar2 = maybe<unsigned_char,_void>::operator->(param_3);
    (ptVar1->
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
    ).super__Tuple_impl<1UL,_pstore::maybe<unsigned_char,_void>_>.
    super__Head_base<1UL,_pstore::maybe<unsigned_char,_void>,_false>._M_head_impl.storage_.__data[0]
         = *puVar2;
    (ptVar1->
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
    ).super__Tuple_impl<1UL,_pstore::maybe<unsigned_char,_void>_>.
    super__Head_base<1UL,_pstore::maybe<unsigned_char,_void>,_false>._M_head_impl.valid_ = true;
  }
  (ptVar1->
  super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
  ).
  super__Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_false>
  ._M_head_impl = param_2;
  return;
}

Assistant:

explicit error_or (in_place_t const inp, Args &&... args)
                : has_error_{false} {
            (void) inp;
            new (get_storage ()) storage_type (std::forward<Args> (args)...);
        }